

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O1

void __thiscall nivalis::Plotter::render(Plotter *this,View *view)

{
  Environment *this_00;
  vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *this_01;
  pointer *ppPVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  pointer pPVar6;
  pointer pAVar7;
  pointer pEVar8;
  pointer pEVar9;
  pointer pdVar10;
  iterator __position;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *pvVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  vector<nivalis::Function,_std::allocator<nivalis::Function>_> *pvVar18;
  _Type afVar19;
  array<double,_2UL> *paVar20;
  undefined8 uVar21;
  bool bVar22;
  int iVar23;
  uint64_t uVar24;
  long lVar25;
  ulong uVar26;
  ASTNode *pAVar27;
  ulong uVar28;
  int iVar29;
  int *piVar30;
  pointer pFVar31;
  uint uVar32;
  color *pcVar33;
  Expr *pEVar34;
  color *pcVar35;
  Plotter *this_02;
  Expr *this_03;
  color *in_R8;
  ulong in_R9;
  ulong uVar36;
  double __tmp;
  double dVar37;
  anon_union_8_3_343d95dd_for_ASTNode_1 aVar38;
  anon_union_8_3_343d95dd_for_ASTNode_1 aVar39;
  anon_union_8_3_343d95dd_for_ASTNode_1 extraout_XMM0_Qa;
  double dVar40;
  vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *pvVar41;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined1 auVar47 [16];
  vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *pvVar48;
  DrawBufferObject obj;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> line;
  color ret;
  double r;
  uint in_stack_fffffffffffffd88;
  Plotter *pPVar49;
  double local_260;
  double local_240;
  undefined1 local_238 [16];
  float local_21c;
  undefined1 local_218 [24];
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined1 local_1f8 [16];
  bool local_1e8;
  uint7 uStack_1e7;
  color *local_1c8;
  _Alloc_hider local_1c0;
  size_type local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  anon_enum_32 local_1a0;
  color *local_198;
  color *pcStack_190;
  float local_17c;
  double local_178;
  double local_170;
  vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *local_168;
  undefined1 local_158 [88];
  _Alloc_hider local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_enum_32 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  anon_union_8_3_343d95dd_for_ASTNode_1 local_b8;
  anon_union_8_3_343d95dd_for_ASTNode_1 aStack_b0;
  double *local_a8;
  undefined4 *local_90;
  color *local_88;
  double local_78;
  double local_70;
  double local_68;
  color local_60;
  
  pcVar2 = local_218 + 0x10;
  local_218._8_8_ = local_218._0_8_;
  local_218._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"x","");
  this_00 = &this->env;
  uVar24 = Environment::addr_of(this_00,(string *)local_218,false);
  this->x_var = (uint32_t)uVar24;
  if ((pointer)local_218._0_8_ != pcVar2) {
    operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
  }
  local_218._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"y","");
  uVar24 = Environment::addr_of(this_00,(string *)local_218,false);
  this->y_var = (uint32_t)uVar24;
  if ((pointer)local_218._0_8_ != pcVar2) {
    operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
  }
  local_218._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"t","");
  uVar24 = Environment::addr_of(this_00,(string *)local_218,false);
  this->t_var = (uint32_t)uVar24;
  if ((pointer)local_218._0_8_ != pcVar2) {
    operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
  }
  dVar37 = view->xmin - view->xmax;
  dVar40 = view->ymin - view->ymax;
  local_178 = dVar37 * dVar37 + dVar40 * dVar40;
  if (local_178 < 0.0) {
    local_178 = sqrt(local_178);
  }
  else {
    local_178 = SQRT(local_178);
  }
  bVar5 = this->loss_detail;
  this->loss_detail = false;
  local_168 = &this->pt_markers;
  pPVar6 = (this->pt_markers).
           super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->pt_markers).
      super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar6) {
    (this->pt_markers).
    super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar6;
  }
  std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::reserve(local_168,500);
  this_01 = &this->draw_buf;
  std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
  _M_erase_at_end(this_01,(this->draw_buf).
                          super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  pFVar31 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar25 = (long)(this->funcs).
                 super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pFVar31;
  pPVar49 = this;
  if (lVar25 != 0) {
    uVar26 = (lVar25 >> 4) * -0x79435e50d79435e5;
    uVar36 = 0;
    do {
      if ((pFVar31[uVar36].type & 0xfffffff0U) == 0) {
        piVar30 = *(int **)&pFVar31[uVar36].expr.ast.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl;
        lVar25 = (long)*(pointer *)
                        ((long)&pFVar31[uVar36].expr.ast.
                                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                        + 8) - (long)piVar30;
        if (lVar25 != 0) {
          lVar25 = lVar25 >> 4;
          lVar25 = lVar25 + (ulong)(lVar25 == 0);
          do {
            if (*piVar30 == 0xc) {
              if (uVar26 <= this->max_functions_find_crit_points) {
                uVar26 = (ulong)(&this->x_var)[(pFVar31[uVar36].type & 0xfffffff8U) == 8];
                Expr::diff((Expr *)local_218,&pFVar31[uVar36].expr,uVar26,this_00);
                pEVar34 = &pFVar31[uVar36].diff;
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                _M_move_assign(&pEVar34->ast);
                this = pPVar49;
                if ((pointer)local_218._0_8_ != (pointer)0x0) {
                  operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
                  this = pPVar49;
                }
                bVar22 = Expr::is_null(pEVar34);
                if (bVar22) {
                  Expr::ASTNode::ASTNode((ASTNode *)local_218,null);
                  pAVar7 = pFVar31[uVar36].ddiff.ast.
                           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  *(undefined8 *)pAVar7 = local_218._0_8_;
                  (pAVar7->field_1).ref = local_218._8_8_;
                }
                else {
                  Expr::diff((Expr *)local_218,pEVar34,uVar26,this_00);
                  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                  _M_move_assign(&pFVar31[uVar36].ddiff.ast,(ASTNode *)local_218);
                  if ((pointer)local_218._0_8_ != (pointer)0x0) {
                    operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
                  }
                }
                pPVar49 = this;
                Expr::diff((Expr *)local_218,&pFVar31[uVar36].recip,uVar26,this_00);
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                _M_move_assign(&pFVar31[uVar36].drecip.ast);
                if ((pointer)local_218._0_8_ != (pointer)0x0) {
                  operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
                }
              }
              break;
            }
            piVar30 = piVar30 + 4;
            lVar25 = lVar25 + -1;
          } while (lVar25 != 0);
        }
      }
      uVar36 = uVar36 + 1;
      pFVar31 = (this->funcs).
                super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar26 = ((long)(this->funcs).
                      super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pFVar31 >> 4) *
               -0x79435e50d79435e5;
    } while (uVar36 < uVar26);
  }
  pFVar31 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
      _M_impl.super__Vector_impl_data._M_finish != pFVar31) {
    pcVar33 = (color *)0x0;
    do {
      pcVar35 = pcVar33;
      if ((pFVar31[(long)pcVar33].type & 0xfffffff8U) == 0x80) {
        pEVar8 = pFVar31[(long)pcVar33].exprs.
                 super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pEVar9 = pFVar31[(long)pcVar33].exprs.
                 super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((pEVar9 != pEVar8) && (((uint)((int)pEVar9 - (int)pEVar8) >> 3 & 1) == 0)) {
          fVar44 = 0.0;
          local_158._0_4_ = 0.0;
          local_158._4_4_ = 0.0;
          local_158._8_8_ = (array<double,_2UL> *)0x0;
          local_158._16_8_ = (array<double,_2UL> *)0x0;
          local_198 = pcVar33;
          if (pFVar31[(long)pcVar33].exprs.
              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              pFVar31[(long)pcVar33].exprs.
              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
              super__Vector_impl_data._M_start) {
            lVar25 = 0x18;
            uVar26 = 0;
            do {
              pEVar8 = pFVar31[(long)pcVar33].exprs.
                       super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pEVar34 = (Expr *)((long)&pEVar8[-1].ast.
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl + lVar25);
              local_1f8._0_4_ = -NAN;
              local_1f8._4_4_ = -NAN;
              local_1f8._8_4_ = -NAN;
              local_1f8._12_4_ = -NAN;
              bVar22 = Expr::is_ref(pEVar34);
              if (bVar22) {
                pAVar27 = Expr::operator[](pEVar34,0);
                uVar24 = (pAVar27->field_1).ref;
                local_1f8._0_4_ = (undefined4)uVar24;
                local_1f8._4_4_ = (undefined4)(uVar24 >> 0x20);
                pdVar10 = (this_00->vars).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                if (NAN(pdVar10[uVar24])) {
                  pdVar10[uVar24] = 1.0;
                }
              }
              this_03 = (Expr *)((long)&(pEVar8->ast).
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl + lVar25);
              bVar22 = Expr::is_ref(this_03);
              if (bVar22) {
                pAVar27 = Expr::operator[](this_03,0);
                uVar24 = (pAVar27->field_1).ref;
                local_1f8._8_4_ = (undefined4)uVar24;
                local_1f8._12_4_ = (undefined4)(uVar24 >> 0x20);
                pdVar10 = (this_00->vars).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                if (NAN(pdVar10[uVar24])) {
                  pdVar10[uVar24] = 1.0;
                }
              }
              aVar38.val = Expr::operator()(pEVar34,this_00);
              aVar39.val = Expr::operator()(this_03,this_00);
              if ((ABS(aVar39.val) != INFINITY && ABS(aVar38.val) != INFINITY) &&
                  (!NAN(aVar38.val) && !NAN(aVar39.val))) {
                local_238._0_8_ = aVar39.ref;
                local_b8.val = aVar38.val;
                aStack_b0.val = aVar39.val;
                if (local_158._8_8_ == local_158._16_8_) {
                  std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
                  _M_realloc_insert<std::array<double,2ul>>
                            ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>
                              *)local_158,(iterator)local_158._8_8_,(array<double,_2UL> *)&local_b8)
                  ;
                }
                else {
                  *(double *)local_158._8_8_ = (double)aVar38;
                  ((anon_union_8_3_343d95dd_for_ASTNode_1 *)((double *)local_158._8_8_ + 1))->val =
                       (double)aVar39;
                  local_158._8_8_ = local_158._8_8_ + 0x10;
                }
                local_218._16_8_ = local_218._16_8_ & 0xffffffff00000000;
                local_218._8_8_ = aVar39.ref;
                local_218._0_8_ = aVar38.ref;
                local_1e8 = false;
                _uStack_200 = local_198;
                __position._M_current =
                     (pPVar49->pt_markers).
                     super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (pPVar49->pt_markers).
                    super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::
                  _M_realloc_insert<nivalis::PointMarker>
                            (local_168,__position,(PointMarker *)local_218);
                  aVar39 = extraout_XMM0_Qa;
                }
                else {
                  *(ulong *)&(__position._M_current)->passive = (ulong)uStack_1e7 << 8;
                  uVar15 = local_1f8._4_4_;
                  uVar14 = local_1f8._0_4_;
                  auVar43._0_8_ = CONCAT44(uVar15,uVar14);
                  auVar43._8_4_ = local_1f8._8_4_;
                  auVar43._12_4_ = local_1f8._12_4_;
                  (__position._M_current)->drag_var_x = auVar43._0_8_;
                  (__position._M_current)->drag_var_y = auVar43._8_8_;
                  *(undefined8 *)&(__position._M_current)->label = local_218._16_8_;
                  (__position._M_current)->rel_func = (size_t)local_198;
                  (__position._M_current)->x = (double)aVar38;
                  (__position._M_current)->y = (double)aVar39;
                  ppPVar1 = &(pPVar49->pt_markers).
                             super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppPVar1 = *ppPVar1 + 1;
                  aVar39.val = aVar38.val;
                }
              }
              fVar44 = aVar39.call_info[0];
              uVar26 = uVar26 + 2;
              lVar25 = lVar25 + 0x30;
            } while (uVar26 < (ulong)(((long)pFVar31[(long)pcVar33].exprs.
                                             super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pFVar31[(long)pcVar33].exprs.
                                             super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x5555555555555555));
          }
          pcVar35 = local_198;
          uVar32 = pFVar31[(long)pcVar33].type;
          in_R8 = (color *)(ulong)(uVar32 & 1);
          bVar22 = (uVar32 & 4) == 0;
          in_R9 = (ulong)bVar22;
          in_stack_fffffffffffffd88 = (uVar32 & 2) >> 1;
          anon_unknown_1::buf_add_polyline
                    (this_01,(View *)local_158,
                     (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     &pFVar31[(long)pcVar33].line_color,local_198,(size_t)in_R8,fVar44,bVar22,
                     SUB41(in_stack_fffffffffffffd88,0),SUB81(pPVar49,0));
          if ((_Type)local_158._0_8_ != (_Type)0x0) {
            operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
          }
        }
      }
      pcVar33 = (color *)((long)pcVar35->data + 1);
      pFVar31 = (pPVar49->funcs).
                super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (pcVar33 < (color *)(((long)(pPVar49->funcs).
                                        super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar31
                                 >> 4) * -0x79435e50d79435e5));
  }
  pFVar31 = (pPVar49->funcs).
            super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((pPVar49->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
      _M_impl.super__Vector_impl_data._M_finish == pFVar31) {
LAB_00141743:
    if (pPVar49->loss_detail == false) {
      if (bVar5 != false) {
        (pPVar49->func_error)._M_string_length = 0;
        *(pPVar49->func_error)._M_dataplus._M_p = '\0';
      }
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&pPVar49->func_error,0,(char *)(pPVar49->func_error)._M_string_length,
                 0x21e0b2);
    }
    return;
  }
  local_178 = local_178 * 0.01;
  pcVar33 = (color *)0x0;
  this_02 = pPVar49;
LAB_00140655:
  pPVar49 = this_02;
  switch((uint)pFVar31[(long)pcVar33].type >> 3) {
  case 0:
    bVar22 = false;
    goto LAB_00140c7c;
  case 1:
    bVar22 = true;
LAB_00140c7c:
    plot_explicit(this_02,(size_t)pcVar33,bVar22);
    break;
  case 2:
    plot_implicit(this_02,(size_t)pcVar33);
    break;
  case 3:
    local_158._0_4_ = 0.0;
    local_158._4_4_ = 0.0;
    local_158._8_8_ = (array<double,_2UL> *)0x0;
    local_158._16_8_ = (array<double,_2UL> *)0x0;
    local_a8 = (double *)0x0;
    local_b8.ref = 0;
    aStack_b0.ref = 0;
    local_240 = (double)pFVar31[(long)pcVar33].tmin;
    dVar40 = (double)pFVar31[(long)pcVar33].tmax;
    local_260 = dVar40;
    if (pFVar31[(long)pcVar33].tmin <= pFVar31[(long)pcVar33].tmax) {
      local_260 = local_240;
      local_240 = dVar40;
    }
    uVar32 = pFVar31[(long)pcVar33].type;
    if ((uVar32 & 1) != 0) {
      dVar40 = (local_240 - local_260) / 0.0031415926535897933 + 1.0;
      uVar26 = (ulong)dVar40;
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)&local_b8,
                 (long)(dVar40 - 9.223372036854776e+18) & (long)uVar26 >> 0x3f | uVar26);
    }
    if ((uVar32 & 2) == 0) {
      dVar40 = (local_240 - local_260) / 0.0031415926535897933 + 1.0;
      uVar26 = (ulong)dVar40;
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::reserve
                ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                 local_158,(long)(dVar40 - 9.223372036854776e+18) & (long)uVar26 >> 0x3f | uVar26);
    }
    if (local_260 <= local_240) {
      dVar40 = local_260;
      do {
        local_238._0_8_ = dVar40;
        (this_02->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[this_02->t_var] = dVar40;
        local_60.data._0_8_ = Expr::operator()(&pFVar31[(long)pcVar33].expr,this_00);
        if ((uVar32 & 1) != 0) {
          if ((double *)aStack_b0.ref == local_a8) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_b8,(iterator)aStack_b0,
                       (double *)&local_60);
          }
          else {
            *(undefined8 *)aStack_b0 = local_60.data._0_8_;
            aStack_b0.ref = aStack_b0.ref + 8;
          }
        }
        if ((uVar32 & 2) == 0) {
          local_198 = (color *)local_60.data._0_8_;
          pcStack_190 = (color *)0x0;
          local_168 = (vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                      cos(dVar40);
          pcStack_190 = (color *)local_60.data._0_8_;
          dVar37 = sin(dVar40);
          local_218._8_4_ = SUB84(dVar37 * (double)pcStack_190,0);
          local_218._0_8_ = (double)local_168 * (double)local_198;
          local_218._12_4_ = (int)((ulong)(dVar37 * (double)pcStack_190) >> 0x20);
          if (local_158._8_8_ == local_158._16_8_) {
            std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
            _M_realloc_insert<std::array<double,2ul>>
                      ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)
                       local_158,(iterator)local_158._8_8_,(array<double,_2UL> *)local_218);
          }
          else {
            *(double *)local_158._8_8_ = (double)local_168 * (double)local_198;
            ((anon_union_8_3_343d95dd_for_ASTNode_1 *)((double *)local_158._8_8_ + 1))->ref =
                 local_218._8_8_;
            local_158._8_8_ = local_158._8_8_ + 0x10;
          }
        }
        dVar40 = dVar40 + 0.0031415926535897933;
      } while (dVar40 <= local_240);
    }
    if ((uVar32 & 2) == 0) {
      in_stack_fffffffffffffd88 = 0;
      in_R8 = (color *)0x0;
      in_R9 = 1;
      anon_unknown_1::buf_add_polyline
                (this_01,(View *)local_158,
                 (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                 &pFVar31[(long)pcVar33].line_color,pcVar33,0,SUB84(local_240,0),true,false,
                 SUB81(this_02,0));
    }
    if ((uVar32 & 1) != 0) {
      local_238._0_8_ = fmod(local_260,6.283185307179586);
      local_238._8_8_ = extraout_XMM0_Qb;
      dVar40 = fmod(local_240,6.283185307179586);
      iVar23 = view->shigh;
      if (0 < iVar23) {
        fVar44 = (float)iVar23;
        local_78 = local_260 -
                   (double)(~-(ulong)((double)local_238._0_8_ < 0.0) & local_238._0_8_ |
                           (ulong)((double)local_238._0_8_ + 6.283185307179586) &
                           -(ulong)((double)local_238._0_8_ < 0.0));
        dVar40 = (double)(~-(ulong)(dVar40 < 0.0) & (ulong)dVar40 |
                         (ulong)(dVar40 + 6.283185307179586) & -(ulong)(dVar40 < 0.0));
        local_198 = (color *)((double)(~-(ulong)(dVar40 == 0.0) &
                                      (ulong)(6.283185307179586 - dVar40)) + local_240 + local_240);
        pcStack_190 = (color *)0x0;
        local_21c = 0.0;
        do {
          iVar29 = view->swid;
          if (0 < iVar29) {
            local_68 = ((view->ymax - view->ymin) * (double)(fVar44 - local_21c)) / (double)iVar23 +
                       view->ymin;
            local_70 = local_68 * local_68;
            fVar44 = 0.0;
            do {
              dVar40 = ((view->xmax - view->xmin) * (double)fVar44) / (double)iVar29 + view->xmin;
              local_17c = fVar44;
              dVar37 = atan2(local_68,dVar40);
              dVar40 = dVar40 * dVar40 + local_70;
              if (dVar40 < 0.0) {
                auVar12._8_4_ = (int)extraout_XMM0_Qb_00;
                auVar12._0_8_ = dVar37;
                auVar12._12_4_ = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
                local_238._8_8_ = auVar12._8_8_;
                local_170 = sqrt(dVar40);
              }
              else {
                local_170 = SQRT(dVar40);
              }
              aVar39 = local_b8;
              fVar44 = SUB84(dVar37,0);
              if (local_78 <= (double)local_198) {
                pcVar35 = (color *)(~-(ulong)(dVar37 < 0.0) & (ulong)dVar37 |
                                   (ulong)(dVar37 + 6.283185307179586) & -(ulong)(dVar37 < 0.0));
                uVar26 = ((long)(aStack_b0.ref - (long)local_b8) >> 3) - 1;
                auVar17._8_8_ = 0;
                auVar17._0_8_ = local_238._8_8_;
                local_238 = auVar17 << 0x40;
                auVar47._8_8_ = 0;
                auVar47._0_8_ = local_78;
                local_88 = pcVar35;
                do {
                  dVar40 = (double)pcVar35 + (double)auVar47._0_8_;
                  if ((local_260 <= dVar40) && (dVar40 <= local_240)) {
                    local_168 = auVar47._0_8_;
                    dVar40 = round((dVar40 - local_260) / 0.0031415926535897933);
                    uVar45 = 0;
                    uVar46 = 0;
                    if (0.0 <= dVar40) {
                      uVar45 = SUB84(dVar40,0);
                      uVar46 = (undefined4)((ulong)dVar40 >> 0x20);
                    }
                    uVar28 = (long)((double)CONCAT44(uVar46,uVar45) - 9.223372036854776e+18) &
                             (long)(double)CONCAT44(uVar46,uVar45) >> 0x3f |
                             (long)(double)CONCAT44(uVar46,uVar45);
                    uVar36 = uVar26;
                    if (uVar28 <= uVar26) {
                      uVar36 = uVar28;
                    }
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = (double)local_168;
                    dVar40 = (double)local_238._0_8_ * 0.75 + 0.25;
                    if (((uVar32 & 4) == 0) == local_170 < *(double *)(aVar39.ref + uVar36 * 8)) {
                      dVar40 = (double)local_238._0_8_;
                    }
                    local_238._0_8_ = dVar40;
                    pcVar35 = local_88;
                  }
                  auVar47._0_8_ = auVar47._0_8_ + 6.283185307179586;
                } while (auVar47._0_8_ <= (double)local_198);
              }
              else {
                auVar16._8_8_ = 0;
                auVar16._0_8_ = local_238._8_8_;
                local_238 = auVar16 << 0x40;
              }
              if (0.0 < (double)local_238._0_8_) {
                color::color::color((color *)local_218,&pFVar31[(long)pcVar33].line_color);
                *(float *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_) =
                     (float)(double)local_238._0_8_;
                anon_unknown_1::buf_add_screen_rectangle
                          (this_01,view,local_17c,local_21c,1.5,1.5,SUB81((color *)local_218,0),
                           pcVar33,fVar44,(size_t)in_R8);
              }
              iVar29 = view->swid;
              fVar44 = local_17c + 1.5;
            } while (fVar44 < (float)iVar29);
          }
          iVar23 = view->shigh;
          fVar44 = (float)iVar23;
          local_21c = local_21c + 1.5;
        } while (local_21c < fVar44);
      }
    }
    afVar19 = (_Type)local_158._0_8_;
    paVar20 = (array<double,_2UL> *)local_158._16_8_;
    if ((double *)local_b8.ref != (double *)0x0) {
      operator_delete((void *)local_b8,(long)local_a8 - (long)local_b8);
      afVar19 = (_Type)local_158._0_8_;
      paVar20 = (array<double,_2UL> *)local_158._16_8_;
    }
    goto joined_r0x00140c4d;
  default:
    goto switchD_00140684_caseD_4;
  case 5:
    if ((long)pFVar31[(long)pcVar33].exprs.
              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)pFVar31[(long)pcVar33].exprs.
              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
              super__Vector_impl_data._M_start != 0x30) goto switchD_00140684_caseD_4;
    local_218._0_16_ = ZEXT816(0);
    local_218._16_8_ = (array<double,_2UL> *)0x0;
    pvVar48 = (vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
              (double)pFVar31[(long)pcVar33].tmin;
    pvVar41 = (vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
              (double)pFVar31[(long)pcVar33].tmax;
    pvVar13 = pvVar48;
    if (pFVar31[(long)pcVar33].tmin <= pFVar31[(long)pcVar33].tmax) {
      pvVar13 = pvVar41;
      pvVar41 = pvVar48;
    }
    dVar40 = ((double)pvVar13 - (double)pvVar41) / 10000.0;
    if ((double)pvVar41 <= (double)pvVar13) {
      local_170 = 1e-12;
      if (1e-12 <= dVar40) {
        local_170 = dVar40;
      }
      local_88 = &pFVar31[(long)pcVar33].line_color;
      local_238._0_8_ = local_c8;
      local_168 = pvVar41;
      do {
        local_198 = (color *)CONCAT44(local_d8._4_4_,(undefined4)local_d8);
        (this_02->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[this_02->t_var] = (double)pvVar41;
        local_c8 = Expr::operator()(pFVar31[(long)pcVar33].exprs.
                                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                    ._M_impl.super__Vector_impl_data._M_start,this_00);
        uStack_c0 = extraout_XMM0_Qb_01;
        local_d8 = Expr::operator()(pFVar31[(long)pcVar33].exprs.
                                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1,this_00);
        uStack_d0 = extraout_XMM0_Qb_02;
        if ((double)local_168 < (double)pvVar41) {
          dVar40 = (local_c8 - (double)local_238._0_8_) * (local_c8 - (double)local_238._0_8_) +
                   (local_d8 - (double)local_198) * (local_d8 - (double)local_198);
          if (local_178 < dVar40) {
            anon_unknown_1::buf_add_screen_polyline
                      (this_01,view,
                       (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                       local_218,local_88,(size_t)pcVar33,SUB84(dVar40,0),SUB81(in_R9,0),
                       SUB41(in_stack_fffffffffffffd88,0),SUB81(this_02,0));
            if (local_218._8_8_ != local_218._0_8_) {
              local_218._8_8_ = local_218._0_8_;
            }
          }
        }
        uVar3 = view->swid;
        uVar4 = view->shigh;
        auVar42._0_8_ = (double)(int)uVar3 * (local_c8 - view->xmin);
        auVar42._8_8_ = (double)(int)uVar4 * (view->ymax - local_d8);
        dVar40 = view->ymax - view->ymin;
        auVar11._8_4_ = SUB84(dVar40,0);
        auVar11._0_8_ = view->xmax - view->xmin;
        auVar11._12_4_ = (int)((ulong)dVar40 >> 0x20);
        auVar43 = divpd(auVar42,auVar11);
        local_158._0_4_ = (undefined4)auVar43._0_8_;
        local_158._4_4_ = (undefined4)auVar43._8_8_;
        std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>::
        emplace_back<std::array<float,2ul>>
                  ((vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)local_218,
                   (array<float,_2UL> *)local_158);
        pvVar41 = (vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                  ((double)pvVar41 + local_170);
        local_238._0_8_ = local_c8;
      } while ((double)pvVar41 <= (double)pvVar13);
    }
    else {
    }
    in_R8 = pcVar33;
    anon_unknown_1::buf_add_screen_polyline
              (this_01,view,
               (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)local_218
               ,&pFVar31[(long)pcVar33].line_color,(size_t)pcVar33,(float)local_c8,SUB81(in_R9,0),
               SUB41(in_stack_fffffffffffffd88,0),SUB81(this_02,0));
    pPVar49 = this_02;
joined_r0x00140e18:
    if ((pointer)local_218._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
    }
    break;
  case 0x11:
    if ((long)pFVar31[(long)pcVar33].exprs.
              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)pFVar31[(long)pcVar33].exprs.
              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
              super__Vector_impl_data._M_start != 0x60) goto switchD_00140684_caseD_4;
    local_218._0_16_ = ZEXT816(0);
    local_218._16_8_ = (array<double,_2UL> *)0x0;
    color::color::color((color *)local_1f8);
    local_1c0._M_p = (pointer)&local_1b0;
    local_1b8 = 0;
    local_1b0._M_local_buf[0] = '\0';
    local_1c8 = pcVar33;
    color::color::operator=
              ((color *)local_158,(color *)local_1f8,&pFVar31[(long)pcVar33].line_color);
    uStack_200 = 0x40000000;
    local_1a0 = RECT;
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
              ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               local_218,2);
    uVar21 = local_218._0_8_;
    dVar40 = Expr::operator()(pFVar31[(long)pcVar33].exprs.
                              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                              _M_impl.super__Vector_impl_data._M_start,this_00);
    *(double *)uVar21 = dVar40;
    dVar40 = Expr::operator()(pFVar31[(long)pcVar33].exprs.
                              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                              _M_impl.super__Vector_impl_data._M_start + 1,this_00);
    *(double *)(uVar21 + 8) = dVar40;
    dVar40 = Expr::operator()(pFVar31[(long)pcVar33].exprs.
                              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                              _M_impl.super__Vector_impl_data._M_start + 2,this_00);
    *(double *)(uVar21 + 0x10) = dVar40;
    dVar40 = Expr::operator()(pFVar31[(long)pcVar33].exprs.
                              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                              _M_impl.super__Vector_impl_data._M_start + 3,this_00);
    *(double *)(uVar21 + 0x18) = dVar40;
    dVar40 = *(double *)uVar21;
    if (*(double *)(uVar21 + 0x10) < dVar40) {
      *(double *)uVar21 = *(double *)(uVar21 + 0x10);
      *(double *)(uVar21 + 0x10) = dVar40;
    }
    dVar40 = *(double *)(uVar21 + 8);
    if (*(double *)(uVar21 + 0x18) < dVar40) {
      *(double *)(uVar21 + 8) = *(double *)(uVar21 + 0x18);
      *(double *)(uVar21 + 0x18) = dVar40;
    }
    if ((pFVar31[(long)pcVar33].type & 2) != 0) {
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
                ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                 local_158,
                 (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                 local_218);
      local_158._24_4_ = uStack_200;
      color::color::color((color *)(local_158 + 0x20),(color *)local_1f8);
      local_158._80_8_ = local_1c8;
      local_100._M_p = (pointer)&local_f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,local_1c0._M_p,local_1c0._M_p + local_1b8);
      local_e0 = FILLED_RECT;
      color::color::color((color *)&local_b8,&pFVar31[(long)pcVar33].line_color);
      *local_90 = 0x3e800000;
      color::color::operator=(&local_60,(color *)(local_158 + 0x20),(color *)&local_b8);
      std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
      emplace_back<nivalis::DrawBufferObject>(this_01,(DrawBufferObject *)local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_p != &local_f0) {
        operator_delete(local_100._M_p,local_f0._M_allocated_capacity + 1);
      }
      if ((_Type)local_158._0_8_ != (_Type)0x0) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
      }
    }
    if ((pFVar31[(long)pcVar33].type & 4) == 0) {
      std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
      emplace_back<nivalis::DrawBufferObject>(this_01,(DrawBufferObject *)local_218);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_p != &local_1b0) {
      operator_delete(local_1c0._M_p,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    afVar19 = (_Type)local_218._0_8_;
    paVar20 = (array<double,_2UL> *)local_218._16_8_;
joined_r0x00140c4d:
    pPVar49 = this_02;
    if (afVar19 != (_Type)0x0) {
      operator_delete((void *)afVar19,(long)paVar20 - (long)afVar19);
    }
    break;
  case 0x12:
  case 0x13:
    uVar32 = pFVar31[(long)pcVar33].type & 0xfffffff8;
    if (((long)pFVar31[(long)pcVar33].exprs.
               super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)pFVar31[(long)pcVar33].exprs.
               super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
        ((ulong)(uVar32 == 0x98) + 3) != 0) goto switchD_00140684_caseD_4;
    local_218._0_16_ = ZEXT816(0);
    local_218._16_8_ = (array<double,_2UL> *)0x0;
    color::color::color((color *)local_1f8);
    local_1c0._M_p = (pointer)&local_1b0;
    local_1b8 = 0;
    local_1b0._M_local_buf[0] = '\0';
    local_1c8 = pcVar33;
    color::color::operator=
              ((color *)local_158,(color *)local_1f8,&pFVar31[(long)pcVar33].line_color);
    uStack_200 = 0x40000000;
    local_1a0 = (uVar32 == 0x98) + 7 + (uint)(uVar32 == 0x98);
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
              ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               local_218,2);
    uVar21 = local_218._0_8_;
    dVar40 = Expr::operator()(pFVar31[(long)pcVar33].exprs.
                              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                              _M_impl.super__Vector_impl_data._M_start,this_00);
    *(double *)uVar21 = dVar40;
    dVar40 = Expr::operator()(pFVar31[(long)pcVar33].exprs.
                              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                              _M_impl.super__Vector_impl_data._M_start + 1,this_00);
    *(double *)(uVar21 + 8) = dVar40;
    dVar40 = *(double *)uVar21;
    dVar37 = Expr::operator()(pFVar31[(long)pcVar33].exprs.
                              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                              _M_impl.super__Vector_impl_data._M_start + 2,this_00);
    *(double *)(uVar21 + 0x10) = dVar40 + dVar37;
    *(double *)(uVar21 + 0x18) = *(double *)(uVar21 + 8);
    if (uVar32 == 0x98) {
      dVar40 = Expr::operator()(pFVar31[(long)pcVar33].exprs.
                                super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                                _M_impl.super__Vector_impl_data._M_start + 3,this_00);
      *(double *)(uVar21 + 0x18) = dVar40 + *(double *)(uVar21 + 0x18);
    }
    if ((pFVar31[(long)pcVar33].type & 2) != 0) {
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
                ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                 local_158,
                 (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                 local_218);
      local_158._24_4_ = uStack_200;
      color::color::color((color *)(local_158 + 0x20),(color *)local_1f8);
      local_158._80_8_ = local_1c8;
      local_100._M_p = (pointer)&local_f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,local_1c0._M_p,local_1c0._M_p + local_1b8);
      local_e0 = (uVar32 == 0x98) + 8 + (uint)(uVar32 == 0x98);
      color::color::color((color *)&local_b8,&pFVar31[(long)pcVar33].line_color);
      *local_90 = 0x3e800000;
      color::color::operator=(&local_60,(color *)(local_158 + 0x20),(color *)&local_b8);
      std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
      emplace_back<nivalis::DrawBufferObject>(this_01,(DrawBufferObject *)local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_p != &local_f0) {
        operator_delete(local_100._M_p,local_f0._M_allocated_capacity + 1);
      }
      if ((_Type)local_158._0_8_ != (_Type)0x0) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
      }
    }
    if ((pFVar31[(long)pcVar33].type & 4) == 0) {
      std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
      emplace_back<nivalis::DrawBufferObject>(this_01,(DrawBufferObject *)local_218);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_p != &local_1b0) {
      operator_delete(local_1c0._M_p,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    pPVar49 = this_02;
    if ((pointer)local_218._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
    }
    break;
  case 0x14:
    if ((long)pFVar31[(long)pcVar33].exprs.
              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)pFVar31[(long)pcVar33].exprs.
              super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
              super__Vector_impl_data._M_start == 0x30) {
      local_218._0_16_ = ZEXT816(0);
      local_218._16_8_ = (array<double,_2UL> *)0x0;
      color::color::color((color *)local_1f8);
      local_1c0._M_p = (pointer)&local_1b0;
      local_1b8 = 0;
      local_1b0._M_local_buf[0] = '\0';
      local_1c8 = pcVar33;
      color::color::operator=
                ((color *)local_158,(color *)local_1f8,&pFVar31[(long)pcVar33].line_color);
      local_1a0 = TEXT;
      local_158._0_8_ =
           Expr::operator()(pFVar31[(long)pcVar33].exprs.
                            super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                            _M_impl.super__Vector_impl_data._M_start,this_00);
      local_158._8_8_ =
           Expr::operator()(pFVar31[(long)pcVar33].exprs.
                            super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1,this_00);
      std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
      _M_assign_aux<std::array<double,2ul>const*>
                ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)local_218,
                 local_158,local_158 + 0x10);
      std::__cxx11::string::_M_assign((string *)&local_1c0);
      std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
      emplace_back<nivalis::DrawBufferObject>(this_01,(DrawBufferObject *)local_218);
      pPVar49 = this_02;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_p != &local_1b0) {
        operator_delete(local_1c0._M_p,
                        CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) +
                        1);
      }
      goto joined_r0x00140e18;
    }
    goto switchD_00140684_caseD_4;
  }
LAB_0014171a:
  pcVar33 = (color *)((long)pcVar33->data + 1);
  pFVar31 = (this_02->funcs).
            super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
            super__Vector_impl_data._M_start;
  pvVar18 = &this_02->funcs;
  this_02 = pPVar49;
  if ((color *)(((long)(pvVar18->
                       super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pFVar31 >> 4) *
               -0x79435e50d79435e5) <= pcVar33) goto LAB_00141743;
  goto LAB_00140655;
switchD_00140684_caseD_4:
  goto LAB_0014171a;
}

Assistant:

void Plotter::render(const View& view) {
    // Re-register some special vars, just in case they got deleted
    x_var = env.addr_of("x", false);
    y_var = env.addr_of("y", false);
    t_var = env.addr_of("t", false);

    // * Constants
    // Number of different t values to evaluate for a parametric equation
    static const double PARAMETRIC_STEPS = 1e4;
    // Number of different t values to evaluate for a polar function
    static const double POLAR_STEP_SIZE = M_PI * 1e-3;
    // If parametric function moves more than this amount (square of l2),
    // disconnects the function line
    const double PARAMETRIC_DISCONN_THRESH = 1e-2 *
        std::sqrt(util::sqr_dist(view.xmin, view.ymin, view.xmax, view.ymax));

    bool prev_loss_detail = loss_detail;
    loss_detail = false; // Will set to show 'some detail may be lost'

    // * Clear back buffers
    pt_markers.clear(); pt_markers.reserve(500);
    draw_buf.clear();

    for (size_t funcid = 0; funcid < funcs.size(); ++funcid) {
        auto& func = funcs[funcid];
        auto ftype_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
        if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT ||
                ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
            bool has_call = false;
            for (size_t i = 0 ; i < funcs[funcid].expr.ast.size(); ++i) {
                if (funcs[funcid].expr.ast[i].opcode == OpCode::call) {
                    has_call = true;
                    break;
                }
            }
            if (has_call && funcs.size() <= max_functions_find_crit_points) {
                // Re-compute derivatives, if explicit and has
                // at least one user-function call
                // This is needed since the user function may have been changed
                if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT ||
                        ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
                    uint64_t var = ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y ?  y_var : x_var;
                    func.diff = func.expr.diff(var, env);
                    if (!func.diff.is_null()) {
                        func.ddiff = func.diff.diff(var, env);
                    }
                    else func.ddiff.ast[0] = OpCode::null;
                    func.drecip = func.recip.diff(var, env);
                }
            }
        }
    }

    // * Draw functions
    // BEGIN_PROFILE;
    for (size_t funcid = 0; funcid < funcs.size(); ++funcid) {
        auto& func = funcs[funcid];
        if ((func.type & ~Function::FUNC_TYPE_MOD_ALL) ==
                Function::FUNC_TYPE_GEOM_POLYLINE) {
            // Draw polyline
            // Do this first since it can affect other functions in the same frame
            // e.g (p, q) moved
            if (func.exprs.size() && (func.exprs.size() & 1) == 0) {
                std::vector<std::array<double, 2> > line;
                double mark_radius = MARKER_DISP_RADIUS - 1;
                for (size_t i = 0; i < func.exprs.size(); i += 2) {
                    PointMarker ptm;
                    auto& expr_x = func.exprs[i],
                    & expr_y = func.exprs[i+1];
                    ptm.drag_var_x = ptm.drag_var_y = -1;
                    if (expr_x.is_ref()) {
                        ptm.drag_var_x = expr_x[0].ref;
                        if (std::isnan(env.vars[ptm.drag_var_x])) {
                            env.vars[ptm.drag_var_x] = 1.;
                        }
                    }
                    if (expr_y.is_ref()) {
                        ptm.drag_var_y = expr_y[0].ref;
                        if (std::isnan(env.vars[ptm.drag_var_y])) {
                            env.vars[ptm.drag_var_y] = 1.;
                        }
                    }
                    double x = expr_x(env), y = expr_y(env);
                    if (std::isnan(x) || std::isnan(y) ||
                            std::isinf(x) || std::isinf(y)) {
                        continue;
                    }
                    line.push_back({x, y});
                    ptm.label = PointMarker::LABEL_NONE;
                    ptm.y = y; ptm.x = x;
                    ptm.passive = false;
                    ptm.rel_func = funcid;
                    pt_markers.push_back(std::move(ptm));
                }
                buf_add_polyline(draw_buf, view, line, func.line_color,
                        funcid, 2.f,
                        func.type & Function::FUNC_TYPE_MOD_CLOSED,
                        (func.type & Function::FUNC_TYPE_MOD_NOLINE) == 0,
                        func.type & Function::FUNC_TYPE_MOD_FILLED);
            }
        }
    }
    // Draw all other functions
    for (size_t funcid = 0; funcid < funcs.size(); ++funcid) {
        auto& func = funcs[funcid];
        auto ftype_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
        switch (ftype_nomod) {
            case Function::FUNC_TYPE_IMPLICIT:
                plot_implicit(funcid); break;
            case Function::FUNC_TYPE_PARAMETRIC:
                {
                    if (func.exprs.size() != 2) continue;
                    std::vector<std::array<float, 2> > curr_line;
                    double tmin = (double)func.tmin;
                    double tmax = (double)func.tmax;
                    if (tmin > tmax) std::swap(tmin, tmax);
                    double tstep = std::max((tmax - tmin) / PARAMETRIC_STEPS, 1e-12);
                    double px, py;
                    for (double t = tmin; t <= tmax; t += tstep) {
                        env.vars[t_var] = t;
                        double x = func.exprs[0](env),
                               y = func.exprs[1](env);
                        if (t > tmin && util::sqr_dist(x, y, px, py) > PARAMETRIC_DISCONN_THRESH) {
                            buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.f);
                            curr_line.clear();
                        }
                        float sx = _X_TO_SX(x), sy = _Y_TO_SY(y);
                        curr_line.push_back({sx, sy});
                        px = x; py = y;
                    }
                    buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.f);
                }
                break;
            case Function::FUNC_TYPE_POLAR:
                {
                    std::vector<std::array<double, 2> > curr_line;
                    std::vector<double> vals;
                    double tmin = (double)func.tmin;
                    double tmax = (double)func.tmax;
                    if (tmin > tmax) std::swap(tmin, tmax);
                    bool has_line = ((func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0);
                    bool is_ineq = (func.type & Function::FUNC_TYPE_MOD_INEQ) != 0;
                    bool is_ineq_less = (func.type & Function::FUNC_TYPE_MOD_INEQ_LESS) != 0;
                    if (is_ineq) {
                        vals.reserve((tmax - tmin) / POLAR_STEP_SIZE + 1);
                    }
                    if (has_line) {
                        curr_line.reserve((tmax - tmin) / POLAR_STEP_SIZE + 1);
                    }
                    for (double t = tmin; t <= tmax; t += POLAR_STEP_SIZE) {
                        env.vars[t_var] = t;
                        double r = func.expr(env);
                        if (is_ineq) vals.push_back(r);
                        if (has_line) {
                            double x = r * cos(t), y = r * sin(t);
                            curr_line.push_back({x, y});
                        }
                    }
                    if (has_line) {
                        buf_add_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.f,
                                false, true, false);
                    }
                    if (is_ineq) {
                        const float INTERVAL = 1.5f;
                        double beg_mod = std::fmod(tmin, 2*M_PI);
                        double end_mod = std::fmod(tmax, 2*M_PI);
                        if (beg_mod < 0) beg_mod += 2 * M_PI;
                        if (end_mod < 0) end_mod += 2 * M_PI;
                        double t_start = tmin - beg_mod;
                        double t_end = tmax + (end_mod == 0.0 ? 0.0 : (2*M_PI - end_mod));
                        for (float sy = 0; sy < view.shigh; sy += INTERVAL) {
                            double y = _SY_TO_Y(sy);
                            for (float sx = 0; sx < view.swid; sx += INTERVAL) {
                                double x = _SX_TO_X(sx);
                                double theta_mod = std::atan2(y, x);
                                double r = std::sqrt(x*x + y*y);
                                if (theta_mod < 0) theta_mod += 2 * M_PI;
                                double alpha = 0.;
                                for (double t = t_start; t <= tmax + t_end; t += 2*M_PI) {
                                    double theta = t + theta_mod;
                                    if (theta < tmin || theta > tmax) continue;
                                    size_t near_idx = std::min((size_t)std::max(
                                                std::round((theta - tmin) / POLAR_STEP_SIZE), 0.),
                                                vals.size() - 1);
                                    double thresh_r = vals[near_idx];
                                    if (r < thresh_r == is_ineq_less) {
                                        alpha = 0.25 + 0.75 * alpha; // Simulate blend
                                    }
                                }
                                if (alpha > 0.) {
                                    color::color c = func.line_color;
                                    c.a = alpha;
                                    buf_add_screen_rectangle(draw_buf, view, sx, sy,
                                            INTERVAL, INTERVAL, true, c, 0.0f, funcid);
                                }
                            }
                        }
                    }
                }
                break;
            case Function::FUNC_TYPE_EXPLICIT:
                plot_explicit(funcid, false); break;
            case Function::FUNC_TYPE_EXPLICIT_Y:
                plot_explicit(funcid, true); break;

            // Geometry (other than polyline)
            case Function::FUNC_TYPE_GEOM_RECT:
                {
                    if (func.exprs.size() != 4) break;
                    DrawBufferObject obj;
                    obj.rel_func = funcid;
                    obj.c = func.line_color;
                    obj.thickness = 2.;
                    obj.type = DrawBufferObject::RECT;
                    obj.points.resize(2);
                    auto& a = obj.points[0], &b = obj.points[1];
                    a[0] = func.exprs[0](env);
                    a[1] = func.exprs[1](env);
                    b[0] = func.exprs[2](env);
                    b[1] = func.exprs[3](env);
                    if (b[0] < a[0]) std::swap(a[0], b[0]);
                    if (b[1] < a[1]) std::swap(a[1], b[1]);
                    if (func.type & Function::FUNC_TYPE_MOD_FILLED) {
                        DrawBufferObject obj2 = obj;
                        obj2.type = DrawBufferObject::FILLED_RECT;
                        obj2.c = get_ineq_color(func.line_color);
                        draw_buf.push_back(std::move(obj2));
                    }
                    if ((func.type & Function::FUNC_TYPE_MOD_NOLINE) == 0) {
                        draw_buf.push_back(std::move(obj));
                    }
                }
                break;
            case Function::FUNC_TYPE_GEOM_CIRCLE:
            case Function::FUNC_TYPE_GEOM_ELLIPSE:
                {
                    size_t is_ellipse = (ftype_nomod == Function::FUNC_TYPE_GEOM_ELLIPSE);
                    if (func.exprs.size() != 3 + is_ellipse) break;
                    DrawBufferObject obj;
                    obj.rel_func = funcid;
                    obj.c = func.line_color;
                    obj.thickness = 2.;
                    obj.type = is_ellipse ? DrawBufferObject::ELLIPSE : DrawBufferObject::CIRCLE;
                    obj.points.resize(2);
                    auto& a = obj.points[0], &right = obj.points[1];
                    a[0] = func.exprs[0](env);
                    a[1] = func.exprs[1](env);
                    right[0] = a[0] + func.exprs[2](env);
                    right[1] = a[1];
                    if (is_ellipse) right[1] += func.exprs[3](env);
                    if (func.type & Function::FUNC_TYPE_MOD_FILLED) {
                        DrawBufferObject obj2 = obj;
                        obj2.type = is_ellipse ? DrawBufferObject::FILLED_ELLIPSE :
                            DrawBufferObject::FILLED_CIRCLE;
                        obj2.c = get_ineq_color(func.line_color);
                        draw_buf.push_back(std::move(obj2));
                    }
                    if ((func.type & Function::FUNC_TYPE_MOD_NOLINE) == 0) {
                        draw_buf.push_back(std::move(obj));
                    }
                }
                break;
            case Function::FUNC_TYPE_GEOM_TEXT:
                {
                    if (func.exprs.size() != 2) break;
                    DrawBufferObject obj;
                    obj.rel_func = funcid;
                    obj.c = func.line_color;
                    obj.type = DrawBufferObject::TEXT;
                    obj.points = { { func.exprs[0](env), func.exprs[1](env) } };
                    obj.str = func.str;
                    draw_buf.push_back(std::move(obj));
                }
                break;
            case Function::FUNC_TYPE_FRACTAL_MANDELBROT:
                {
                }
                break;
        }
    }
    // PROFILE(all);
    if (loss_detail) {
        func_error = "Warning: some detail may be lost";
    } else if (prev_loss_detail) {
        func_error.clear();
    }
}